

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_24::Inhabitator::markNullable(Inhabitator *this,FieldPos field)

{
  int iVar1;
  _Storage<wasm::HeapType,_true> _Var2;
  uintptr_t *puVar3;
  HeapType HVar4;
  bool bVar5;
  optional<wasm::HeapType> *poVar6;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar7;
  Index IVar8;
  optional<wasm::HeapType> *extraout_RDX;
  optional<wasm::HeapType> *extraout_RDX_00;
  optional<wasm::HeapType> *poVar9;
  uintptr_t *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auStack_140 [8];
  FieldPos field_local;
  optional<wasm::HeapType> super;
  optional<wasm::HeapType> *local_88;
  optional<wasm::HeapType> *poStack_80;
  ulong local_70;
  size_t index;
  Index local_60;
  anon_class_16_2_f7f469bf local_58;
  HeapType local_48;
  ulong uStack_40;
  
  auStack_140 = (undefined1  [8])field.first.id;
  field_local.first.id._0_4_ = field.second;
  std::__detail::
  _Insert_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->nullables,(value_type *)auStack_140);
  uStack_40 = CONCAT44(field_local.first.id._4_4_,(uint)field_local.first.id);
  local_48.id = (uintptr_t)auStack_140;
  local_58.this = (Inhabitator *)auStack_140;
  local_58.index = (size_t *)CONCAT44(local_58.index._4_4_,(uint)field_local.first.id);
  if (((ulong)auStack_140 < 0x7d) || (bVar5 = HeapType::isSignature((HeapType *)&local_58), bVar5))
  {
    __assert_fail("!type.isBasic() && !type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c5,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  GCTypeUtils::getField
            ((optional<wasm::Field> *)&field_local.second,(HeapType)local_58.this,
             (Index)local_58.index);
  if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
    __assert_fail("field",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x2c7,
                  "Inhabitator::Variance wasm::(anonymous namespace)::Inhabitator::getVariance(FieldPos)"
                 );
  }
  if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._4_4_ == 1) {
    bVar5 = HeapType::isArray(&local_48);
    HVar4.id = local_48.id;
    if (bVar5) {
      do {
        local_48.id = HVar4.id;
        auVar11 = ::wasm::HeapType::getDeclaredSuperType();
        IVar8 = auVar11._8_4_;
        HVar4.id = auVar11._0_8_;
      } while ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
    }
    else {
      bVar5 = HeapType::isStruct(&local_48);
      if (!bVar5) {
        __assert_fail("curr.isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x2e6,"void wasm::(anonymous namespace)::Inhabitator::markNullable(FieldPos)"
                     );
      }
      while( true ) {
        auVar11 = ::wasm::HeapType::getDeclaredSuperType();
        field_local._8_8_ = auVar11._0_8_;
        IVar8 = auVar11._8_4_;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = auVar11[8];
        if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
        auVar12 = ::wasm::HeapType::getStruct();
        IVar8 = auVar12._8_4_;
        if ((ulong)(auVar12._0_8_[1] - *auVar12._0_8_ >> 4) <= (uStack_40 & 0xffffffff)) break;
        local_48.id = field_local._8_8_;
      }
    }
    HVar4.id = local_48.id;
    local_70 = uStack_40 & 0xffffffff;
    local_58.index = &local_70;
    local_58.this = this;
    markNullable::anon_class_16_2_f7f469bf::operator()(&local_58,local_48,IVar8);
    field_local.second = 0;
    field_local._12_4_ = 0;
    local_88 = (optional<wasm::HeapType> *)0x0;
    poStack_80 = (optional<wasm::HeapType> *)0x0;
    index = (size_t)SubTypes::getImmediateSubTypes(&this->subtypes,HVar4);
    local_60 = 1;
    SmallVector<Item,_10UL>::push_back
              ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)&index);
    while (((long)poStack_80 >> 4) + field_local._8_8_ != 0) {
      if (poStack_80 == (optional<wasm::HeapType> *)0x0) {
        if (field_local._8_8_ == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,"T &wasm::SmallVector<Item, 10>::back() [T = Item, N = 10]");
        }
        field_local._8_8_ = field_local._8_8_ + -1;
        poVar9 = &super;
        poVar6 = poVar9 + field_local._8_8_;
      }
      else {
        poVar6 = poStack_80 + -1;
        poVar9 = local_88;
        poStack_80 = poVar6;
      }
      iVar1 = *(int *)&(poVar6->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged;
      _Var2 = (poVar6->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload;
      puVar3 = *(uintptr_t **)((long)_Var2 + 8);
      for (puVar10 = *(uintptr_t **)_Var2; puVar10 != puVar3; puVar10 = puVar10 + 1) {
        HVar4.id = *puVar10;
        markNullable::anon_class_16_2_f7f469bf::operator()(&local_58,HVar4,(Index)poVar9);
        pvVar7 = SubTypes::getImmediateSubTypes(&this->subtypes,HVar4);
        poVar9 = extraout_RDX;
        if ((pvVar7->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (pvVar7->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          index = (size_t)pvVar7;
          local_60 = iVar1 + 1;
          SmallVector<Item,_10UL>::push_back
                    ((SmallVector<Item,_10UL> *)&field_local.second,(Item *)&index);
          poVar9 = extraout_RDX_00;
        }
      }
    }
    SmallVector<Item,_10UL>::~SmallVector((SmallVector<Item,_10UL> *)&field_local.second);
  }
  else {
    while( true ) {
      auVar11 = ::wasm::HeapType::getDeclaredSuperType();
      if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_4_ =
           (undefined4)uStack_40;
      field_local._8_8_ = auVar11._0_8_;
      std::__detail::
      _Insert<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&this->nullables,(value_type *)&field_local.second);
      local_48.id = auVar11._0_8_;
    }
  }
  return;
}

Assistant:

void Inhabitator::markNullable(FieldPos field) {
  // Mark the given field nullable in the original type and in other types
  // necessary to keep subtyping valid.
  nullables.insert(field);
  auto [curr, idx] = field;
  switch (getVariance(field)) {
    case Covariant:
      // Mark the field null in all supertypes. If the supertype field is
      // already nullable or does not exist, that's ok and this will have no
      // effect.
      while (auto super = curr.getDeclaredSuperType()) {
        nullables.insert({*super, idx});
        curr = *super;
      }
      break;
    case Invariant:
      // Find the top type for which this field exists and mark the field
      // nullable in all of its subtypes.
      if (curr.isArray()) {
        while (auto super = curr.getDeclaredSuperType()) {
          curr = *super;
        }
      } else {
        assert(curr.isStruct());
        while (auto super = curr.getDeclaredSuperType()) {
          if (super->getStruct().fields.size() <= idx) {
            break;
          }
          curr = *super;
        }
      }
      // Mark the field nullable in all subtypes. If the subtype field is
      // already nullable, that's ok and this will have no effect. TODO: Remove
      // this extra `index` variable once we have C++20. It's a workaround for
      // lambdas being unable to capture structured bindings.
      const size_t index = idx;
      subtypes.iterSubTypes(curr, [&](HeapType type, Index) {
        nullables.insert({type, index});
      });
      break;
  }
}